

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

Territory __thiscall QTzTimeZonePrivate::territory(QTzTimeZonePrivate *this)

{
  Type *this_00;
  long in_FS_OFFSET;
  QTzTimeZone local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
                      ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>
                        *)this);
  QHash<QByteArray,_QTzTimeZone>::value(&local_38,this_00,&(this->super_QTimeZonePrivate).m_id);
  if (&(local_38.comment.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_38.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_38.comment.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_38.territory;
  }
  __stack_chk_fail();
}

Assistant:

QLocale::Territory QTzTimeZonePrivate::territory() const
{
    return tzZones->value(m_id).territory;
}